

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_0::ArrayComparisonTest<const_int,_const_short>::ArrayComparisonTest
          (ArrayComparisonTest<const_int,_const_short> *this,initializer_list<const_int> left,
          initializer_list<const_short> right,TestOrdering expectedResult)

{
  kj *this_00;
  kj *end;
  
  this_00 = (kj *)right._M_array;
  end = this_00;
  heapArray<int_const,int_const*>
            (&this->left,(kj *)left._M_array,(int *)((kj *)left._M_array + left._M_len * 4),
             (int *)this_00);
  heapArray<short_const,short_const*>(&this->right,this_00,(short *)(this_00 + 4),(short *)end);
  this->expectedResult = (TestOrdering)right._M_len;
  return;
}

Assistant:

ArrayComparisonTest(std::initializer_list<A> left, std::initializer_list<B> right, TestOrdering expectedResult) :
    left(heapArray(left)), right(heapArray(right)), expectedResult(expectedResult) {}